

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::dht_get_mutable_item
          (session_impl *this,array<char,_32UL> key,string *salt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  dht_tracker *this_00;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  string local_58;
  public_key local_38;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_38.bytes._M_elems[0x10] = key._M_elems[0x10];
    local_38.bytes._M_elems[0x11] = key._M_elems[0x11];
    local_38.bytes._M_elems[0x12] = key._M_elems[0x12];
    local_38.bytes._M_elems[0x13] = key._M_elems[0x13];
    local_38.bytes._M_elems[0x14] = key._M_elems[0x14];
    local_38.bytes._M_elems[0x15] = key._M_elems[0x15];
    local_38.bytes._M_elems[0x16] = key._M_elems[0x16];
    local_38.bytes._M_elems[0x17] = key._M_elems[0x17];
    local_38.bytes._M_elems[0x18] = key._M_elems[0x18];
    local_38.bytes._M_elems[0x19] = key._M_elems[0x19];
    local_38.bytes._M_elems[0x1a] = key._M_elems[0x1a];
    local_38.bytes._M_elems[0x1b] = key._M_elems[0x1b];
    local_38.bytes._M_elems[0x1c] = key._M_elems[0x1c];
    local_38.bytes._M_elems[0x1d] = key._M_elems[0x1d];
    local_38.bytes._M_elems[0x1e] = key._M_elems[0x1e];
    local_38.bytes._M_elems[0x1f] = key._M_elems[0x1f];
    local_38.bytes._M_elems[0] = key._M_elems[0];
    local_38.bytes._M_elems[1] = key._M_elems[1];
    local_38.bytes._M_elems[2] = key._M_elems[2];
    local_38.bytes._M_elems[3] = key._M_elems[3];
    local_38.bytes._M_elems[4] = key._M_elems[4];
    local_38.bytes._M_elems[5] = key._M_elems[5];
    local_38.bytes._M_elems[6] = key._M_elems[6];
    local_38.bytes._M_elems[7] = key._M_elems[7];
    local_38.bytes._M_elems[8] = key._M_elems[8];
    local_38.bytes._M_elems[9] = key._M_elems[9];
    local_38.bytes._M_elems[10] = key._M_elems[10];
    local_38.bytes._M_elems[0xb] = key._M_elems[0xb];
    local_38.bytes._M_elems[0xc] = key._M_elems[0xc];
    local_38.bytes._M_elems[0xd] = key._M_elems[0xd];
    local_38.bytes._M_elems[0xe] = key._M_elems[0xe];
    local_38.bytes._M_elems[0xf] = key._M_elems[0xf];
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78._M_unused._M_object = operator_new(0x18);
    *(code **)local_78._M_unused._0_8_ = get_mutable_callback;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
    *(session_impl **)((long)local_78._M_unused._0_8_ + 0x10) = this;
    pcStack_60 = ::std::
                 _Function_handler<void_(const_libtorrent::dht::item_&,_bool),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::dht::item_&,_bool)>_>
                 ::_M_invoke;
    local_68 = ::std::
               _Function_handler<void_(const_libtorrent::dht::item_&,_bool),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::dht::item_&,_bool)>_>
               ::_M_manager;
    local_58._M_dataplus._M_p = (salt->_M_dataplus)._M_p;
    paVar1 = &salt->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar1) {
      local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_58.field_2._8_8_ = *(undefined8 *)((long)&salt->field_2 + 8);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_58._M_string_length = salt->_M_string_length;
    (salt->_M_dataplus)._M_p = (pointer)paVar1;
    salt->_M_string_length = 0;
    (salt->field_2)._M_local_buf[0] = '\0';
    libtorrent::dht::dht_tracker::get_item
              (this_00,&local_38,(function<void_(const_libtorrent::dht::item_&,_bool)> *)&local_78,
               &local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}